

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void highbd_clamp_epi32_sse4_1
               (__m128i *in,__m128i *out,__m128i *clamp_lo,__m128i *clamp_hi,int size)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  lVar11 = 0x30;
  for (lVar12 = 0; lVar12 < size; lVar12 = lVar12 + 4) {
    piVar1 = (int *)((long)in[-3] + lVar11);
    iVar3 = *piVar1;
    iVar4 = piVar1[1];
    iVar5 = piVar1[2];
    iVar6 = piVar1[3];
    iVar7 = (int)(*clamp_lo)[0];
    iVar8 = *(int *)((long)*clamp_lo + 4);
    iVar9 = (int)(*clamp_lo)[1];
    iVar10 = *(int *)((long)*clamp_lo + 0xc);
    uVar13 = (uint)(iVar3 < iVar7) * iVar7 | (uint)(iVar3 >= iVar7) * iVar3;
    uVar14 = (uint)(iVar4 < iVar8) * iVar8 | (uint)(iVar4 >= iVar8) * iVar4;
    uVar15 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
    uVar16 = (uint)(iVar6 < iVar10) * iVar10 | (uint)(iVar6 >= iVar10) * iVar6;
    iVar3 = (int)(*clamp_hi)[0];
    iVar4 = *(int *)((long)*clamp_hi + 4);
    iVar5 = (int)(*clamp_hi)[1];
    iVar6 = *(int *)((long)*clamp_hi + 0xc);
    puVar2 = (uint *)((long)out[-3] + lVar11);
    *puVar2 = (uint)(iVar3 < (int)uVar13) * iVar3 | (iVar3 >= (int)uVar13) * uVar13;
    puVar2[1] = (uint)(iVar4 < (int)uVar14) * iVar4 | (iVar4 >= (int)uVar14) * uVar14;
    puVar2[2] = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    puVar2[3] = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
    piVar1 = (int *)((long)in[-2] + lVar11);
    iVar3 = *piVar1;
    iVar4 = piVar1[1];
    iVar5 = piVar1[2];
    iVar6 = piVar1[3];
    iVar7 = (int)(*clamp_lo)[0];
    iVar8 = *(int *)((long)*clamp_lo + 4);
    iVar9 = (int)(*clamp_lo)[1];
    iVar10 = *(int *)((long)*clamp_lo + 0xc);
    uVar13 = (uint)(iVar3 < iVar7) * iVar7 | (uint)(iVar3 >= iVar7) * iVar3;
    uVar14 = (uint)(iVar4 < iVar8) * iVar8 | (uint)(iVar4 >= iVar8) * iVar4;
    uVar15 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
    uVar16 = (uint)(iVar6 < iVar10) * iVar10 | (uint)(iVar6 >= iVar10) * iVar6;
    iVar3 = (int)(*clamp_hi)[0];
    iVar4 = *(int *)((long)*clamp_hi + 4);
    iVar5 = (int)(*clamp_hi)[1];
    iVar6 = *(int *)((long)*clamp_hi + 0xc);
    puVar2 = (uint *)((long)out[-2] + lVar11);
    *puVar2 = (uint)(iVar3 < (int)uVar13) * iVar3 | (iVar3 >= (int)uVar13) * uVar13;
    puVar2[1] = (uint)(iVar4 < (int)uVar14) * iVar4 | (iVar4 >= (int)uVar14) * uVar14;
    puVar2[2] = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    puVar2[3] = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
    piVar1 = (int *)((long)in[-1] + lVar11);
    iVar3 = *piVar1;
    iVar4 = piVar1[1];
    iVar5 = piVar1[2];
    iVar6 = piVar1[3];
    iVar7 = (int)(*clamp_lo)[0];
    iVar8 = *(int *)((long)*clamp_lo + 4);
    iVar9 = (int)(*clamp_lo)[1];
    iVar10 = *(int *)((long)*clamp_lo + 0xc);
    uVar13 = (uint)(iVar3 < iVar7) * iVar7 | (uint)(iVar3 >= iVar7) * iVar3;
    uVar14 = (uint)(iVar4 < iVar8) * iVar8 | (uint)(iVar4 >= iVar8) * iVar4;
    uVar15 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
    uVar16 = (uint)(iVar6 < iVar10) * iVar10 | (uint)(iVar6 >= iVar10) * iVar6;
    iVar3 = (int)(*clamp_hi)[0];
    iVar4 = *(int *)((long)*clamp_hi + 4);
    iVar5 = (int)(*clamp_hi)[1];
    iVar6 = *(int *)((long)*clamp_hi + 0xc);
    puVar2 = (uint *)((long)out[-1] + lVar11);
    *puVar2 = (uint)(iVar3 < (int)uVar13) * iVar3 | (iVar3 >= (int)uVar13) * uVar13;
    puVar2[1] = (uint)(iVar4 < (int)uVar14) * iVar4 | (iVar4 >= (int)uVar14) * uVar14;
    puVar2[2] = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    puVar2[3] = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
    piVar1 = (int *)((long)*in + lVar11);
    iVar3 = *piVar1;
    iVar4 = piVar1[1];
    iVar5 = piVar1[2];
    iVar6 = piVar1[3];
    iVar7 = (int)(*clamp_lo)[0];
    iVar8 = *(int *)((long)*clamp_lo + 4);
    iVar9 = (int)(*clamp_lo)[1];
    iVar10 = *(int *)((long)*clamp_lo + 0xc);
    uVar13 = (uint)(iVar3 < iVar7) * iVar7 | (uint)(iVar3 >= iVar7) * iVar3;
    uVar14 = (uint)(iVar4 < iVar8) * iVar8 | (uint)(iVar4 >= iVar8) * iVar4;
    uVar15 = (uint)(iVar5 < iVar9) * iVar9 | (uint)(iVar5 >= iVar9) * iVar5;
    uVar16 = (uint)(iVar6 < iVar10) * iVar10 | (uint)(iVar6 >= iVar10) * iVar6;
    iVar3 = (int)(*clamp_hi)[0];
    iVar4 = *(int *)((long)*clamp_hi + 4);
    iVar5 = (int)(*clamp_hi)[1];
    iVar6 = *(int *)((long)*clamp_hi + 0xc);
    puVar2 = (uint *)((long)*out + lVar11);
    *puVar2 = (uint)(iVar3 < (int)uVar13) * iVar3 | (iVar3 >= (int)uVar13) * uVar13;
    puVar2[1] = (uint)(iVar4 < (int)uVar14) * iVar4 | (iVar4 >= (int)uVar14) * uVar14;
    puVar2[2] = (uint)(iVar5 < (int)uVar15) * iVar5 | (iVar5 >= (int)uVar15) * uVar15;
    puVar2[3] = (uint)(iVar6 < (int)uVar16) * iVar6 | (iVar6 >= (int)uVar16) * uVar16;
    lVar11 = lVar11 + 0x40;
  }
  return;
}

Assistant:

static void highbd_clamp_epi32_sse4_1(__m128i *in, __m128i *out,
                                      const __m128i *clamp_lo,
                                      const __m128i *clamp_hi, int size) {
  __m128i a0, a1;
  for (int i = 0; i < size; i += 4) {
    a0 = _mm_max_epi32(in[i], *clamp_lo);
    out[i] = _mm_min_epi32(a0, *clamp_hi);

    a1 = _mm_max_epi32(in[i + 1], *clamp_lo);
    out[i + 1] = _mm_min_epi32(a1, *clamp_hi);

    a0 = _mm_max_epi32(in[i + 2], *clamp_lo);
    out[i + 2] = _mm_min_epi32(a0, *clamp_hi);

    a1 = _mm_max_epi32(in[i + 3], *clamp_lo);
    out[i + 3] = _mm_min_epi32(a1, *clamp_hi);
  }
}